

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_secret.cpp
# Opt level: O3

void __thiscall
duckdb::Transformer::TransformCreateSecretOptions
          (Transformer *this,CreateSecretInfo *info,
          optional_ptr<duckdb_libpgquery::PGList,_true> options)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  __uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
  _Var1;
  ParsedExpression *pPVar2;
  undefined8 uVar3;
  int iVar4;
  iterator iVar5;
  pointer pPVar6;
  type pPVar7;
  Transformer *this_01;
  mapped_type *pmVar8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_02;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> this_03;
  BinderException *this_04;
  PGListCell *pPVar9;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var10;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  string lower_name;
  case_insensitive_map_t<vector<ParsedExpression>_> vector_options;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> local_158;
  undefined1 local_150 [32];
  undefined1 local_130 [64];
  optional_ptr<duckdb_libpgquery::PGList,_true> local_f0;
  undefined1 local_e8 [32];
  Value local_c8;
  undefined1 local_88 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::ParsedExpression,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::ParsedExpression,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (options.ptr != (PGList *)0x0) {
    local_150._16_8_ = info;
    local_f0.ptr = options.ptr;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_f0);
    pPVar9 = (local_f0.ptr)->head;
    if (pPVar9 != (PGListCell *)0x0) {
      local_150._24_8_ = local_150._16_8_ + 0x188;
      local_150._8_8_ = local_150._16_8_ + 0x158;
      this_00 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)(local_150._16_8_ + 0x130);
      do {
        local_158.ptr = (PGDefElem *)(pPVar9->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_158);
        ::std::__cxx11::string::string
                  ((string *)local_130,(local_158.ptr)->defname,(allocator *)&local_c8);
        StringUtil::Lower((string *)local_e8,(string *)local_130);
        if ((Transformer *)local_130._0_8_ != (Transformer *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_);
        }
        iVar4 = ::std::__cxx11::string::compare((char *)local_e8);
        if (iVar4 == 0) {
          optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_158);
          TransformExpression((Transformer *)local_130,
                              (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
          uVar3 = local_130._0_8_;
          local_130._0_8_ = (Transformer *)0x0;
          _Var10._M_head_impl =
               (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(local_150._16_8_ + 0x180))->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             *)(local_150._16_8_ + 0x180))->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)uVar3;
          if (_Var10._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var10._M_head_impl)->super_BaseExpression + 8))();
            if ((Transformer *)local_130._0_8_ != (Transformer *)0x0) {
              (**(code **)(*(long *)local_130._0_8_ + 8))();
            }
          }
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)local_e8);
          if (iVar4 == 0) {
            optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_158);
            TransformExpression((Transformer *)local_130,
                                (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
            uVar3 = local_130._0_8_;
            local_130._0_8_ = (Transformer *)0x0;
            _Var10._M_head_impl =
                 (this_00->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (this_00->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)uVar3;
            if (_Var10._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var10._M_head_impl)->super_BaseExpression + 8))();
              if ((Transformer *)local_130._0_8_ != (Transformer *)0x0) {
                (**(code **)(*(long *)local_130._0_8_ + 8))();
              }
            }
            pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(this_00);
            if ((pPVar6->super_BaseExpression).type == COLUMN_REF) {
              pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator*(this_00);
              GetConstantExpressionValue(&local_c8,pPVar7);
              this_02._M_head_impl = (ParsedExpression *)operator_new(0x78);
              Value::Value((Value *)local_130,&local_c8);
              ConstantExpression::ConstantExpression
                        ((ConstantExpression *)this_02._M_head_impl,(Value *)local_130);
              Value::~Value((Value *)local_130);
              _Var10._M_head_impl =
                   (this_00->
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              (this_00->
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   this_02._M_head_impl;
LAB_007970f1:
              if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   )_Var10._M_head_impl != (ParsedExpression *)0x0) {
                (**(code **)(*(long *)_Var10._M_head_impl + 8))();
              }
              Value::~Value(&local_c8);
            }
          }
          else {
            iVar4 = ::std::__cxx11::string::compare((char *)local_e8);
            if (iVar4 == 0) {
              optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_158);
              TransformExpression((Transformer *)local_130,
                                  (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
              uVar3 = local_130._0_8_;
              local_130._0_8_ = (Transformer *)0x0;
              _Var1.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   *(__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     *)local_150._8_8_;
              *(undefined8 *)local_150._8_8_ = uVar3;
              if (_Var1.
                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
                  (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  )0x0) {
                (**(code **)(*(long *)_Var1.
                                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                      _M_head_impl + 8))();
                if ((Transformer *)local_130._0_8_ != (Transformer *)0x0) {
                  (**(code **)(*(long *)local_130._0_8_ + 8))();
                }
              }
              pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)local_150._8_8_);
              if ((pPVar6->super_BaseExpression).type == COLUMN_REF) {
                pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_150._8_8_);
                GetConstantExpressionValue(&local_c8,pPVar7);
                this_03.
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      )operator_new(0x78);
                Value::Value((Value *)local_130,&local_c8);
                ConstantExpression::ConstantExpression
                          ((ConstantExpression *)
                           this_03.
                           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                           (Value *)local_130);
                Value::~Value((Value *)local_130);
                _Var10._M_head_impl = *(ParsedExpression **)local_150._8_8_;
                *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  *)local_150._8_8_ =
                     this_03.
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                goto LAB_007970f1;
              }
            }
            else {
              local_68._M_buckets = &local_68._M_single_bucket;
              local_68._M_bucket_count = 1;
              local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_68._M_element_count = 0;
              local_68._M_rehash_policy._M_max_load_factor = 1.0;
              local_68._M_rehash_policy._M_next_resize = 0;
              local_68._M_single_bucket = (__node_base_ptr)0x0;
              iVar5 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_150._24_8_,(string *)local_e8);
              if (iVar5.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
                  ._M_cur != (__node_type *)0x0) {
                this_04 = (BinderException *)__cxa_allocate_exception(0x10);
                local_130._0_8_ = local_130 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_130,
                           "Duplicate query param found while parsing create secret: \'%s\'","");
                local_88._0_8_ = local_88 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_88,local_e8._0_8_,
                           (undefined1 *)((long)(_Hash_node_base **)local_e8._0_8_ + local_e8._8_8_)
                          );
                BinderException::BinderException<std::__cxx11::string>
                          (this_04,(string *)local_130,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
                __cxa_throw(this_04,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_158);
              TransformExpression((Transformer *)local_150,
                                  (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
              pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)local_150);
              if ((pPVar6->super_BaseExpression).type == COLUMN_REF) {
                pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                      *)local_150);
                GetConstantExpressionValue(&local_c8,pPVar7);
                this_01 = (Transformer *)operator_new(0x78);
                Value::Value((Value *)local_130,&local_c8);
                ConstantExpression::ConstantExpression
                          ((ConstantExpression *)this_01,(Value *)local_130);
                Value::~Value((Value *)local_130);
                if ((Transformer *)local_150._0_8_ != (Transformer *)0x0) {
                  pPVar2 = (ParsedExpression *)local_150._0_8_;
                  local_150._0_8_ = this_01;
                  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[1])();
                  this_01 = (Transformer *)local_150._0_8_;
                }
                local_150._0_8_ = this_01;
                Value::~Value(&local_c8);
              }
              pmVar8 = ::std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_150._24_8_,(string *)local_e8);
              uVar3 = local_150._0_8_;
              local_150._0_8_ = (Transformer *)0x0;
              _Var10._M_head_impl =
                   (pmVar8->
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              (pmVar8->
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (ParsedExpression *)uVar3;
              if (_Var10._M_head_impl != (ParsedExpression *)0x0) {
                (**(code **)(*(long *)&(_Var10._M_head_impl)->super_BaseExpression + 8))();
              }
              if ((Transformer *)local_150._0_8_ != (Transformer *)0x0) {
                (*(((ParsedExpression *)local_150._0_8_)->super_BaseExpression)._vptr_BaseExpression
                  [1])();
              }
              ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::ParsedExpression,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::ParsedExpression,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&local_68);
            }
          }
        }
        if ((__node_base_ptr)local_e8._0_8_ != (__node_base_ptr)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_);
        }
        pPVar9 = pPVar9->next;
      } while (pPVar9 != (PGListCell *)0x0);
    }
  }
  return;
}

Assistant:

void Transformer::TransformCreateSecretOptions(CreateSecretInfo &info,
                                               optional_ptr<duckdb_libpgquery::PGList> options) {
	if (!options) {
		return;
	}

	duckdb_libpgquery::PGListCell *cell;

	// iterate over each option
	for_each_cell(cell, options->head) {
		auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
		auto lower_name = StringUtil::Lower(def_elem->defname);
		if (lower_name == "scope") {
			info.scope = TransformExpression(def_elem->arg);
			continue;
		}
		if (lower_name == "type") {
			info.type = TransformExpression(def_elem->arg);
			if (info.type->type == ExpressionType::COLUMN_REF) {
				info.type = make_uniq<ConstantExpression>(GetConstantExpressionValue(*info.type));
			}
			continue;
		}
		if (lower_name == "provider") {
			info.provider = TransformExpression(def_elem->arg);
			if (info.provider->type == ExpressionType::COLUMN_REF) {
				info.provider = make_uniq<ConstantExpression>(GetConstantExpressionValue(*info.provider));
			}
			continue;
		}

		// All the other options end up in the generic
		case_insensitive_map_t<vector<ParsedExpression>> vector_options;

		if (info.options.find(lower_name) != info.options.end()) {
			throw BinderException("Duplicate query param found while parsing create secret: '%s'", lower_name);
		}

		auto expr = TransformExpression(def_elem->arg);
		if (expr->type == ExpressionType::COLUMN_REF) {
			expr = make_uniq<ConstantExpression>(GetConstantExpressionValue(*expr));
		}
		info.options[lower_name] = std::move(expr);
	}
}